

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall
CEditor::DoButton_ButtonInc
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  int iVar1;
  char *pText_00;
  char *pText_01;
  long in_FS_OFFSET;
  vec4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = GetButtonColor(this,pID,Checked);
  CUIRect::Draw(pRect,&local_48,3.0,10);
  pText_00 = "+";
  if (pText != (char *)0x0) {
    pText_00 = pText;
  }
  iVar1 = 5;
  CUI::DoLabel(&this->m_UI,pRect,pText_00,10.0,5,-1.0,true);
  iVar1 = DoButton_Editor_Common(this,pID,pText_01,iVar1,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_ButtonInc(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	pRect->Draw(GetButtonColor(pID, Checked), 3.0f, CUIRect::CORNER_R);
	UI()->DoLabel(pRect, pText?pText:"+", 10.0f, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}